

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderMaxOutputComponentsTest::getShaderParts
          (GeometryShaderMaxOutputComponentsTest *this,GLchar ***out_fragment_shader_parts,
          uint *out_n_fragment_shader_parts,GLchar ***out_geometry_shader_parts,
          uint *out_n_geometry_shader_parts,GLchar ***out_vertex_shader_parts,
          uint *out_n_vertex_shader_parts)

{
  int iVar1;
  deUint32 err;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x868))
            ((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.m_glExtTokens.
             MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS,&this->m_max_total_output_components);
  (**(code **)(lVar3 + 0x868))
            ((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.m_glExtTokens.
             MAX_GEOMETRY_OUTPUT_COMPONENTS,&this->m_max_output_components);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"glGetIntegerv() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x72c);
  iVar1 = this->m_max_total_output_components / this->m_max_output_components;
  this->m_n_output_points = iVar1;
  iVar2 = this->m_max_output_components / 4;
  this->m_max_output_vectors = iVar2;
  this->m_n_available_vectors = iVar2 + -2;
  this->m_texture_width = iVar1 * 2;
  prepareFragmentShader(this,&this->m_fragment_shader_code);
  this->m_fragment_shader_code_c_str = (this->m_fragment_shader_code)._M_dataplus._M_p;
  *out_fragment_shader_parts = &this->m_fragment_shader_code_c_str;
  *out_n_fragment_shader_parts = 1;
  prepareGeometryShader(this,&this->m_geometry_shader_code);
  this->m_geometry_shader_code_c_str = (this->m_geometry_shader_code)._M_dataplus._M_p;
  *out_geometry_shader_parts = &this->m_geometry_shader_code_c_str;
  *out_n_geometry_shader_parts = 1;
  *out_vertex_shader_parts = &m_vertex_shader_code;
  *out_n_vertex_shader_parts = 1;
  return;
}

Assistant:

void GeometryShaderMaxOutputComponentsTest::getShaderParts(const glw::GLchar* const*& out_fragment_shader_parts,
														   unsigned int&			  out_n_fragment_shader_parts,
														   const glw::GLchar* const*& out_geometry_shader_parts,
														   unsigned int&			  out_n_geometry_shader_parts,
														   const glw::GLchar* const*& out_vertex_shader_parts,
														   unsigned int&			  out_n_vertex_shader_parts)
{
	/* GL functions */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get maximum number of output components */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS, &m_max_total_output_components);
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_OUTPUT_COMPONENTS, &m_max_output_components);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call(s) failed");

	m_n_output_points	 = m_max_total_output_components / m_max_output_components;
	m_max_output_vectors  = m_max_output_components / 4; /* 4 components per vector */
	m_n_available_vectors = m_max_output_vectors - 2;	/* 2 vectors are reserved for gl_Position and gl_PointSize */

	/* Framebuffer width */
	m_texture_width = m_point_size * m_n_output_points;

	/* Fragment shader parts */
	prepareFragmentShader(m_fragment_shader_code);

	m_fragment_shader_code_c_str = m_fragment_shader_code.c_str();
	out_fragment_shader_parts	= &m_fragment_shader_code_c_str;
	out_n_fragment_shader_parts  = 1;

	/* Geometry shader parts */
	prepareGeometryShader(m_geometry_shader_code);

	m_geometry_shader_code_c_str = m_geometry_shader_code.c_str();
	out_geometry_shader_parts	= &m_geometry_shader_code_c_str;
	out_n_geometry_shader_parts  = 1;

	/* Vertex shader */
	out_vertex_shader_parts   = &m_vertex_shader_code;
	out_n_vertex_shader_parts = 1;
}